

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O0

vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *
dg::dda::gatherNonPhisDefs<dg::dda::RWNode::DefUses>
          (ReadWriteGraph *graph,DefUses *nodes,bool intraproc)

{
  RWNode *pRVar1;
  bool bVar2;
  reference ppRVar3;
  byte in_CL;
  undefined8 in_RDX;
  RWNode *in_RDI;
  unsigned_long i;
  const_iterator __end2;
  const_iterator __begin2;
  SparseBitvectorHashImpl *__range2_1;
  RWNode *n;
  const_iterator __end0;
  const_iterator __begin0;
  DefUses *__range2;
  SparseBitvectorHashImpl phis;
  SparseBitvectorHashImpl ret;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *retval;
  undefined4 in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffeec;
  RWNode *this;
  unsigned_long in_stack_ffffffffffffff08;
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  SparseBitvectorHashImpl *in_stack_ffffffffffffff20;
  SparseBitvectorHashImpl *in_stack_ffffffffffffff28;
  RWNode *in_stack_ffffffffffffff30;
  __normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
  local_a0;
  undefined8 local_98;
  byte local_19;
  undefined8 local_18;
  
  local_19 = in_CL & 1;
  this = in_RDI;
  local_18 = in_RDX;
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::SparseBitvectorImpl
            ((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
              *)in_RDI);
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::SparseBitvectorImpl
            ((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
              *)this);
  local_98 = local_18;
  local_a0._M_current =
       (RWNode **)
       RWNode::DefUses::begin
                 ((DefUses *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  RWNode::DefUses::end((DefUses *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                             *)this,(__normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                           ), bVar2) {
    ppRVar3 = __gnu_cxx::
              __normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
              ::operator*(&local_a0);
    pRVar1 = *ppRVar3;
    bVar2 = RWNode::isPhi(this);
    if (bVar2) {
      if (((local_19 & 1) == 0) || (bVar2 = RWNode::isInOut(this), !bVar2)) {
        recGatherNonPhisDefs
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                   (bool)in_stack_ffffffffffffff1f);
      }
      else {
        SubgraphNode<dg::dda::RWNode>::getID(&pRVar1->super_SubgraphNode<dg::dda::RWNode>);
        ADT::
        SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
        ::set(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      }
    }
    else {
      SubgraphNode<dg::dda::RWNode>::getID(&pRVar1->super_SubgraphNode<dg::dda::RWNode>);
      ADT::
      SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
      ::set(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    __gnu_cxx::
    __normal_iterator<dg::dda::RWNode_*const_*,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
    ::operator++(&local_a0);
  }
  std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::vector
            ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)0x178991);
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::size(in_stack_ffffffffffffff10);
  std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::reserve
            ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
             in_stack_ffffffffffffff20,CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18)
            );
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::begin((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
           *)this);
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::end((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
         *)this);
  while (bVar2 = ADT::
                 SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
                 ::const_iterator::operator!=
                           ((const_iterator *)this,
                            (const_iterator *)
                            CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)), bVar2) {
    ADT::
    SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
    ::const_iterator::operator*((const_iterator *)this);
    ReadWriteGraph::getNode((ReadWriteGraph *)this,in_stack_fffffffffffffeec);
    std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::push_back
              ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)this,
               (value_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    ADT::
    SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
    ::const_iterator::operator++((const_iterator *)this);
  }
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::~SparseBitvectorImpl
            ((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
              *)0x178a51);
  ADT::
  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
  ::~SparseBitvectorImpl
            ((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::STLHashMap<unsigned_long,_unsigned_long>_>
              *)0x178a5e);
  return (vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)in_RDI;
}

Assistant:

std::vector<RWNode *> gatherNonPhisDefs(ReadWriteGraph *graph,
                                        const ContT &nodes,
                                        bool intraproc = false) {
    dg::ADT::SparseBitvectorHashImpl ret; // use set to get rid of duplicates
    dg::ADT::SparseBitvectorHashImpl
            phis; // set of visited phi nodes - to check the fixpoint

    for (auto n : nodes) {
        if (!n->isPhi()) {
            assert(n->getID() > 0);
            ret.set(n->getID());
        } else {
            if (intraproc && n->isInOut()) {
                assert(n->getID() > 0);
                ret.set(n->getID());
            } else {
                recGatherNonPhisDefs(n, phis, ret, intraproc);
            }
        }
    }

    std::vector<RWNode *> retval;
    retval.reserve(ret.size());
    for (auto i : ret) {
        retval.push_back(graph->getNode(i));
    }
    return retval;
}